

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

QString * __thiscall QList<QString>::takeAt(QList<QString> *this,qsizetype i)

{
  char *in_RDX;
  QList<QString> *in_RSI;
  QList<QString> *in_RDI;
  QString *t;
  QList<QString> *this_00;
  
  (in_RDI->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (QString *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->d).size = -0x5555555555555556;
  this_00 = in_RDI;
  operator[](in_RDI,(qsizetype)in_RDI);
  QString::QString((QString *)this_00,(QString *)in_RDI);
  remove(in_RSI,in_RDX);
  return (QString *)in_RDI;
}

Assistant:

T takeAt(qsizetype i) { T t = std::move((*this)[i]); remove(i); return t; }